

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O3

void __thiscall
acto::actor::mem_handler_t<msg_finish,_Wall,_const_msg_finish_&>::invoke
          (mem_handler_t<msg_finish,_Wall,_const_msg_finish_&> *this,
          unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *msg)

{
  Wall *pWVar1;
  undefined8 uVar2;
  actor_ref aStack_28;
  Wall *local_20;
  
  pWVar1 = this->ptr_;
  actor_ref::actor_ref
            (&aStack_28,
             ((msg->_M_t).
              super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>._M_t
              .super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
              super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl)->sender,true);
  local_20 = pWVar1;
  if ((this->func_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->func_)._M_invoker)
              ((_Any_data *)&this->func_,&local_20,&aStack_28,
               (msg_finish *)
               ((msg->_M_t).
                super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>.
                _M_t.
                super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>
                .super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl + 1));
    actor_ref::~actor_ref(&aStack_28);
    return;
  }
  uVar2 = std::__throw_bad_function_call();
  actor_ref::~actor_ref(&aStack_28);
  _Unwind_Resume(uVar2);
}

Assistant:

void invoke(std::unique_ptr<core::msg_t> msg) const final {
      func_(ptr_, actor_ref(msg->sender, true),
            static_cast<message_reference_t<M, P>>(*msg.get()).data());
    }